

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefileCall::~cmMakefileCall(cmMakefileCall *this)

{
  pointer *pppcVar1;
  cmMakefile *pcVar2;
  cmListFileBacktrace cStack_28;
  
  pcVar2 = this->Makefile;
  pppcVar1 = &(pcVar2->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppcVar1 = *pppcVar1 + -1;
  cmListFileBacktrace::Pop(&cStack_28,&pcVar2->Backtrace);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,&cStack_28);
  cmListFileBacktrace::~cmListFileBacktrace(&cStack_28);
  return;
}

Assistant:

~cmMakefileCall()
  {
    this->Makefile->ExecutionStatusStack.pop_back();
    this->Makefile->Backtrace = this->Makefile->Backtrace.Pop();
  }